

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O0

int If_Dec6SuppSize(word t)

{
  word wVar1;
  word wVar2;
  undefined4 local_18;
  undefined4 local_14;
  int Count;
  int v;
  word t_local;
  
  local_18 = 0;
  for (local_14 = 0; local_14 < 6; local_14 = local_14 + 1) {
    wVar1 = If_Dec6Cofactor(t,local_14,0);
    wVar2 = If_Dec6Cofactor(t,local_14,1);
    if (wVar1 != wVar2) {
      local_18 = local_18 + 1;
    }
  }
  return local_18;
}

Assistant:

static inline int If_Dec6SuppSize( word t )
{
    int v, Count = 0;
    for ( v = 0; v < 6; v++ )
        if ( If_Dec6Cofactor(t, v, 0) != If_Dec6Cofactor(t, v, 1) )
            Count++;
    return Count;
}